

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::SharedDtor(SentencePieceText_SentencePiece *this)

{
  pointer pcVar1;
  void *pvVar2;
  LogMessage *other;
  string *psVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    pvVar2 = *(void **)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  if (pvVar2 != (void *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece.pb.cc",0x8c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArena() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  if ((undefined8 *)(this->piece_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string) {
    psVar3 = google::protobuf::internal::ArenaStringPtr::UnsafeMutablePointer_abi_cxx11_
                       (&this->piece_);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &psVar3->field_2) {
      operator_delete(pcVar1,(psVar3->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar3,0x20);
  }
  if ((undefined8 *)(this->surface_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string) {
    psVar3 = google::protobuf::internal::ArenaStringPtr::UnsafeMutablePointer_abi_cxx11_
                       (&this->surface_);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &psVar3->field_2) {
      operator_delete(pcVar1,(psVar3->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar3,0x20);
  }
  return;
}

Assistant:

void SentencePieceText_SentencePiece::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  piece_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  surface_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}